

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

char * nng_stat_string(nng_stat *stat)

{
  char *pcVar1;
  
  if (stat->s_info->si_type == NNG_STAT_STRING) {
    pcVar1 = (char *)(stat->s_val).sv_value;
  }
  else {
    pcVar1 = "";
  }
  return pcVar1;
}

Assistant:

const char *
nng_stat_string(const nng_stat *stat)
{
#if NNG_ENABLE_STATS
	if (stat->s_info->si_type != NNG_STAT_STRING) {
		return ("");
	}
	return (stat->s_val.sv_string);
#else
	NNI_ARG_UNUSED(stat);
	return ("");
#endif
}